

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell.c
# Opt level: O3

int percent_success(int spell)

{
  ushort uVar1;
  schar sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  int odd;
  int iVar6;
  long lVar7;
  uint uVar8;
  int iVar9;
  
  iVar6 = urole.spelheal;
  iVar9 = urole.spelbase;
  sVar2 = acurr(urole.spelstat);
  if ((uarm == (obj *)0x0) ||
     (6 < (ushort)((*(ushort *)&objects[uarm->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
    if ((uarmc != (obj *)0x0) && (uarmc->otyp == 0x81)) {
      iVar9 = iVar9 - urole.spelarmr;
    }
  }
  else {
    iVar4 = urole.spelarmr;
    if ((uarmc != (obj *)0x0) && (uarmc->otyp == 0x81)) {
      iVar4 = urole.spelarmr / 2;
    }
    iVar9 = iVar9 + iVar4;
  }
  iVar4 = 0;
  if (uarms != (obj *)0x0) {
    iVar4 = urole.spelshld;
  }
  iVar4 = iVar4 + iVar9;
  if (uarmh != (obj *)0x0) {
    lVar7 = (long)uarmh->otyp;
    iVar9 = iVar4 + 4;
    if ((ushort)((*(ushort *)&objects[lVar7].field_0x11 >> 4 & 0x1f) - 0x12) < 0xfff9) {
      iVar9 = iVar4;
    }
    if (lVar7 == 0x51) {
      iVar9 = iVar4;
    }
    iVar4 = iVar9 + 4;
    if (lVar7 != 0x4f) {
      iVar4 = iVar9;
    }
  }
  iVar9 = iVar4;
  if ((uarmg != (obj *)0x0) &&
     (iVar9 = iVar4 + 6,
     6 < (ushort)((*(ushort *)&objects[uarmg->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
    iVar9 = iVar4;
  }
  iVar4 = iVar9;
  if ((uarmf != (obj *)0x0) &&
     (iVar4 = iVar9 + 2,
     6 < (ushort)((*(ushort *)&objects[uarmf->otyp].field_0x11 >> 4 & 0x1f) - 0xb))) {
    iVar4 = iVar9;
  }
  uVar1 = spl_book[spell].sp_id;
  iVar9 = 0;
  if (urole.spelspec == (short)uVar1) {
    iVar9 = urole.spelsbon;
  }
  iVar9 = iVar9 + iVar4;
  if ((uVar1 - 0x185 < 0x16) && ((0x261011U >> (uVar1 - 0x185 & 0x1f) & 1) != 0)) {
    iVar9 = iVar9 + iVar6;
  }
  uVar5 = (int)(short)(sVar2 * 0xb - ((short)(sVar2 * 0xb) >> 0xf)) >> 1;
  bVar3 = u.weapon_skills[objects[(short)uVar1].oc_subtyp].skill;
  iVar6 = 1;
  if ((char)bVar3 < '\x02') {
    bVar3 = 1;
  }
  iVar4 = (int)((ulong)((long)u.ulevel * 0x55555555) >> 0x20) - u.ulevel;
  iVar4 = spl_book[spell].sp_lev * 4 + (uint)bVar3 * -6 + ((iVar4 >> 1) - (iVar4 >> 0x1f)) + 1;
  if (iVar4 < 1) {
    iVar4 = (iVar4 * -0xf) / (int)spl_book[spell].sp_lev;
    iVar6 = 0x14;
    if (iVar4 < 0x14) {
      iVar6 = iVar4;
    }
    uVar5 = uVar5 + iVar6;
  }
  else {
    iVar4 = iVar4 * 900 + 2000;
    do {
      iVar4 = iVar4 - iVar6;
      iVar6 = iVar6 + 2;
      uVar5 = uVar5 - 1;
    } while (iVar6 <= iVar4);
  }
  if ((int)uVar5 < 1) {
    uVar5 = 0;
  }
  uVar8 = 0x78;
  if ((int)uVar5 < 0x78) {
    uVar8 = uVar5;
  }
  if ((uarms != (obj *)0x0) && (iVar6 = weight(uarms), (int)(uint)objects[0x88].oc_weight < iVar6))
  {
    if (urole.spelspec == spl_book[spell].sp_id) {
      uVar8 = uVar8 >> 1;
    }
    else {
      uVar8 = uVar8 >> 2;
    }
  }
  if (0x13 < iVar9) {
    iVar9 = 0x14;
  }
  iVar9 = ((0x14 - iVar9) * uVar8) / 0xf - iVar9;
  iVar6 = 100;
  if (iVar9 < 100) {
    iVar6 = iVar9;
  }
  iVar9 = 0;
  if (0 < iVar6) {
    iVar9 = iVar6;
  }
  return iVar9;
}

Assistant:

static int percent_success(int spell)
{
	/* Intrinsic and learned ability are combined to calculate
	 * the probability of player's success at cast a given spell.
	 */
	int chance, splcaster, special, statused;
	int difficulty;
	int skill;

	/* Calculate intrinsic ability (splcaster) */

	splcaster = urole.spelbase;
	special = urole.spelheal;
	statused = ACURR(urole.spelstat);

	if (uarm && is_metallic(uarm))
	    splcaster += (uarmc && uarmc->otyp == ROBE) ?
		urole.spelarmr/2 : urole.spelarmr;
	else if (uarmc && uarmc->otyp == ROBE)
	    splcaster -= urole.spelarmr;
	if (uarms) splcaster += urole.spelshld;

	if (uarmh && is_metallic(uarmh) && uarmh->otyp != HELM_OF_BRILLIANCE)
		splcaster += uarmhbon;
	if (uarmh && uarmh->otyp == TINFOIL_HAT)
		splcaster += uarmhbon;
	if (uarmg && is_metallic(uarmg)) splcaster += uarmgbon;
	if (uarmf && is_metallic(uarmf)) splcaster += uarmfbon;

	if (spellid(spell) == urole.spelspec)
		splcaster += urole.spelsbon;

	/* `healing spell' bonus */
	if (spellid(spell) == SPE_HEALING ||
	    spellid(spell) == SPE_EXTRA_HEALING ||
	    spellid(spell) == SPE_CURE_BLINDNESS ||
	    spellid(spell) == SPE_CURE_SICKNESS ||
	    spellid(spell) == SPE_RESTORE_ABILITY ||
	    spellid(spell) == SPE_REMOVE_CURSE) splcaster += special;

	if (splcaster > 20) splcaster = 20;

	/* Calculate learned ability */

	/* Players basic likelihood of being able to cast any spell
	 * is based of their `magic' statistic. (Int or Wis)
	 */
	chance = 11 * statused / 2;

	/*
	 * High level spells are harder.  Easier for higher level casters.
	 * The difficulty is based on the hero's level and their skill level
	 * in that spell type.
	 */
	skill = P_SKILL(spell_skilltype(spellid(spell)));
	skill = max(skill,P_UNSKILLED) - 1;	/* unskilled => 0 */
	difficulty= (spellev(spell)-1) * 4 - ((skill * 6) + (u.ulevel/3) + 1);

	if (difficulty > 0) {
		/* Player is too low level or unskilled. */
		chance -= isqrt(900 * difficulty + 2000);
	} else {
		/* Player is above level.  Learning continues, but the
		 * law of diminishing returns sets in quickly for
		 * low-level spells.  That is, a player quickly gains
		 * no advantage for raising level.
		 */
		int learning = 15 * -difficulty / spellev(spell);
		chance += learning > 20 ? 20 : learning;
	}

	/* Clamp the chance: >18 stat and advanced learning only help
	 * to a limit, while chances below "hopeless" only raise the
	 * specter of overflowing 16-bit ints (and permit wearing a
	 * shield to raise the chances :-).
	 */
	if (chance < 0) chance = 0;
	if (chance > 120) chance = 120;

	/* Wearing anything but a light shield makes it very awkward
	 * to cast a spell.  The penalty is not quite so bad for the
	 * player's role-specific spell.
	 */
	if (uarms && weight(uarms) > (int) objects[SMALL_SHIELD].oc_weight) {
		if (spellid(spell) == urole.spelspec) {
			chance /= 2;
		} else {
			chance /= 4;
		}
	}

	/* Finally, chance (based on player intell/wisdom and level) is
	 * combined with ability (based on player intrinsics and
	 * encumbrances).  No matter how intelligent/wise and advanced
	 * a player is, intrinsics and encumbrance can prevent casting;
	 * and no matter how able, learning is always required.
	 */
	chance = chance * (20-splcaster) / 15 - splcaster;

	/* Clamp to percentile */
	if (chance > 100) chance = 100;
	if (chance < 0) chance = 0;

	return chance;
}